

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

SharedPtr<const_vkt::shaderexecutor::Statement> * __thiscall
de::SharedPtr<const_vkt::shaderexecutor::Statement>::operator=
          (SharedPtr<const_vkt::shaderexecutor::Statement> *this,
          SharedPtr<const_vkt::shaderexecutor::Statement> *other)

{
  SharedPtr<const_vkt::shaderexecutor::Statement> *other_local;
  SharedPtr<const_vkt::shaderexecutor::Statement> *this_local;
  
  if (this->m_state != other->m_state) {
    release(this);
    this->m_ptr = other->m_ptr;
    this->m_state = other->m_state;
    acquire(this);
  }
  return this;
}

Assistant:

inline SharedPtr<T>& SharedPtr<T>::operator= (const SharedPtr<T>& other)
{
	if (m_state == other.m_state)
		return *this;

	// Release current reference.
	release();

	// Copy from other and acquire reference.
	m_ptr	= other.m_ptr;
	m_state	= other.m_state;

	acquire();

	return *this;
}